

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O0

bool __thiscall ON_BrepRegionTopology::Transform(ON_BrepRegionTopology *this,ON_Xform *xform)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ON_BrepFaceSide *pOVar4;
  ON_BrepFace *this_00;
  ON_BrepRegion *this_01;
  ON_BoundingBox *this_02;
  ON_BoundingBox local_70;
  int local_40;
  int local_3c;
  int fi;
  int fsi;
  ON_BrepRegion *r;
  int local_28;
  int face_count;
  int faceside_count;
  int region_count;
  int j;
  int i;
  ON_Xform *xform_local;
  ON_BrepRegionTopology *this_local;
  
  _j = xform;
  xform_local = (ON_Xform *)this;
  face_count = ON_ClassArray<ON_BrepRegion>::Count((ON_ClassArray<ON_BrepRegion> *)&this->m_R);
  local_28 = ON_ClassArray<ON_BrepFaceSide>::Count((ON_ClassArray<ON_BrepFaceSide> *)this);
  if (this->m_brep != (ON_Brep *)0x0) {
    r._4_4_ = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_brep->m_F);
    for (region_count = 0; region_count < face_count; region_count = region_count + 1) {
      _fi = ON_ClassArray<ON_BrepRegion>::operator[]
                      ((ON_ClassArray<ON_BrepRegion> *)&this->m_R,region_count);
      ON_BoundingBox::Destroy(&_fi->m_bbox);
      for (faceside_count = 0; iVar1 = faceside_count,
          iVar2 = ON_SimpleArray<int>::Count(&_fi->m_fsi), iVar1 < iVar2;
          faceside_count = faceside_count + 1) {
        piVar3 = ON_SimpleArray<int>::operator[](&_fi->m_fsi,faceside_count);
        local_3c = *piVar3;
        if ((-1 < local_3c) && (local_3c < local_28)) {
          pOVar4 = ON_ClassArray<ON_BrepFaceSide>::operator[]
                             ((ON_ClassArray<ON_BrepFaceSide> *)this,local_3c);
          local_40 = pOVar4->m_fi;
          if ((-1 < local_40) && (local_40 < r._4_4_)) {
            this_02 = &_fi->m_bbox;
            this_00 = ON_ClassArray<ON_BrepFace>::operator[]
                                ((ON_ClassArray<ON_BrepFace> *)&this->m_brep->m_F,local_40);
            ON_Geometry::BoundingBox(&local_70,(ON_Geometry *)this_00);
            ON_BoundingBox::Union(this_02,&local_70);
          }
        }
      }
    }
  }
  for (region_count = 0; region_count < local_28; region_count = region_count + 1) {
    pOVar4 = ON_ClassArray<ON_BrepFaceSide>::operator[]
                       ((ON_ClassArray<ON_BrepFaceSide> *)this,region_count);
    ON_Object::TransformUserData(&pOVar4->super_ON_Object,_j);
  }
  for (region_count = 0; region_count < face_count; region_count = region_count + 1) {
    this_01 = ON_ClassArray<ON_BrepRegion>::operator[]
                        ((ON_ClassArray<ON_BrepRegion> *)&this->m_R,region_count);
    ON_Object::TransformUserData(&this_01->super_ON_Object,_j);
  }
  return true;
}

Assistant:

bool ON_BrepRegionTopology::Transform( const ON_Xform& xform)
{
  // Transforming the bbox makes it grow too large under repeated
  // rotations.  So, we will destroy it here and reset it below.
  //m_bbox.Transform(xform);
  int i, j;
  const int region_count = m_R.Count();
  const int faceside_count = m_FS.Count();
  if ( nullptr != m_brep )
  {
    const int face_count = m_brep->m_F.Count();
    for (i = 0; i < region_count; i++ )
    {
      ON_BrepRegion& r = m_R[i];
      r.m_bbox.Destroy();
      for ( j = 0; j < r.m_fsi.Count(); j++ )
      {
        int fsi = r.m_fsi[j];
        if ( fsi >= 0 && fsi < faceside_count )
        {
          int fi = m_FS[fsi].m_fi;
          if ( fi >= 0 && fi < face_count )
          {
            r.m_bbox.Union(m_brep->m_F[fi].BoundingBox());
          }
        }
      }
    }
  }

  for ( i = 0; i < faceside_count; i++ )
    m_FS[i].TransformUserData(xform);
  for ( i = 0; i < region_count; i++ )
    m_R[i].TransformUserData(xform);

  return true;
}